

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O2

void __thiscall
boost::ext::ut::v1_1_8::runner<ApprovalTests::cfg::reporter,16>::
on<void(*)(),boost::ext::ut::v1_1_8::none>
          (runner<ApprovalTests::cfg::reporter,16> *this,
          test<void_(*)(),_boost::ext::ut::v1_1_8::none> *test)

{
  runner<ApprovalTests::cfg::reporter,16> *prVar1;
  long lVar2;
  pointer psVar3;
  string_view *psVar4;
  test_begin test_begin;
  test_run test_run;
  test_skip test_skip;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  test_end test_end;
  bool bVar9;
  uint uVar10;
  ostream *poVar11;
  iterator __begin0;
  pointer psVar12;
  char *pcVar13;
  basic_string_view<char,_std::char_traits<char>_> *ftag;
  string_view *psVar14;
  ulong uVar15;
  iterator __end0;
  bool bVar16;
  string_view input;
  string_view input_00;
  string_view pattern;
  undefined4 uStack_7c;
  
  pcVar13 = (test->name).data_;
  lVar2 = *(long *)(this + 600);
  *(unsigned_long *)(this + lVar2 * 0x10 + 0x270) = (test->name).size_;
  *(char **)(this + lVar2 * 0x10 + 0x278) = pcVar13;
  psVar12 = (test->tag).
            super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (test->tag).
           super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar16 = psVar12 == psVar3;
  for (; psVar12 != psVar3; psVar12 = psVar12 + 1) {
    input._M_str = psVar12->data_;
    input._M_len = psVar12->size_;
    pattern._M_str = "skip";
    pattern._M_len = 4;
    bVar9 = utility::is_match(input,pattern);
    if (bVar9) goto LAB_0010af86;
    psVar14 = *(string_view **)(this + 0x388);
    psVar4 = *(string_view **)(this + 0x390);
    do {
      if (psVar14 == psVar4) goto LAB_0010aef4;
      input_00._M_str = psVar12->data_;
      input_00._M_len = psVar12->size_;
      bVar9 = utility::is_match(input_00,*psVar14);
      psVar14 = psVar14 + 1;
    } while (!bVar9);
    bVar16 = true;
LAB_0010aef4:
  }
  if (bVar16) {
    bVar16 = filter::operator()(this + 0x370,*(size_t *)(this + 600),
                                (array<std::basic_string_view<char,_std::char_traits<char>_>,_16UL>
                                 *)(this + 0x270));
    if (bVar16) {
      lVar2 = *(long *)(this + 600);
      *(long *)(this + 600) = lVar2 + 1;
      if (lVar2 == 0) {
        uVar5 = (test->type).data_;
        uVar6 = (test->type).size_;
        test_begin.type.size_ = uVar6;
        test_begin.type.data_ = (char *)uVar5;
        uVar7 = (test->name).data_;
        uVar8 = (test->name).size_;
        test_begin.name.size_ = uVar8;
        test_begin.name.data_ = (char *)uVar7;
        test_begin.location._12_4_ = uStack_7c;
        test_begin.location.line_ = (test->location).line_;
        test_begin.location.file_ = (test->location).file_;
        ApprovalTests::cfg::reporter::on((reporter *)this,test_begin);
      }
      else {
        test_run.type = test->type;
        test_run.name = test->name;
        reporter<boost::ext::ut::v1_1_8::printer>::on
                  ((reporter<boost::ext::ut::v1_1_8::printer> *)this,test_run);
      }
      if (this[0x3a0] == (runner<ApprovalTests::cfg::reporter,16>)0x1) {
        for (uVar10 = 0; uVar15 = (ulong)uVar10, uVar15 < *(ulong *)(this + 600);
            uVar10 = uVar10 + 1) {
          pcVar13 = ".";
          if (uVar15 == 0) {
            pcVar13 = "";
          }
          poVar11 = std::operator<<((ostream *)&std::cout,pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,*(char **)(this + uVar15 * 0x10 + 0x278),
                     *(long *)(this + 0x270 + uVar15 * 0x10));
        }
        std::operator<<((ostream *)&std::cout,'\n');
      }
      (*test->run)();
      prVar1 = this + 600;
      *(long *)prVar1 = *(long *)prVar1 + -1;
      if (*(long *)prVar1 == 0) {
        test_end.type = test->type;
        test_end.name = test->name;
        ApprovalTests::cfg::reporter::on((reporter *)this,test_end);
      }
    }
  }
  else {
LAB_0010af86:
    test_skip.type = test->type;
    test_skip.name = test->name;
    reporter<boost::ext::ut::v1_1_8::printer>::on
              ((reporter<boost::ext::ut::v1_1_8::printer> *)this,test_skip);
  }
  return;
}

Assistant:

auto on(events::test<Ts...> test) {
      path_[level_] = test.name;

      auto execute = std::empty(test.tag);
      for (const auto& tag : test.tag) {
        if (utility::is_match(tag, "skip")) {
          on(events::skip<>{.type = test.type, .name = test.name});
          return;
        }

        for (const auto& ftag : tag_) {
          if (utility::is_match(tag, ftag)) {
            execute = true;
            break;
          }
        }
      }

      if (not execute) {
        on(events::skip<>{.type = test.type, .name = test.name});
        return;
      }

      if (filter_(level_, path_)) {
        if (not level_++) {
          reporter_.on(events::test_begin{
              .type = test.type, .name = test.name, .location = test.location});
        } else {
          reporter_.on(events::test_run{.type = test.type, .name = test.name});
        }

        if (dry_run_) {
          for (auto i = 0u; i < level_; ++i) {
            std::cout << (i ? "." : "") << path_[i];
          }
          std::cout << '\n';
        }

#if defined(__cpp_exceptions)
        try {
#endif
          test();
#if defined(__cpp_exceptions)
        } catch (const events::fatal_assertion&) {
        } catch (const std::exception& exception) {
          ++fails_;
          reporter_.on(events::exception{exception.what()});
        } catch (...) {
          ++fails_;
          reporter_.on(events::exception{"Unknown exception"});
        }
#endif

        if (not--level_) {
          reporter_.on(events::test_end{.type = test.type, .name = test.name});
        }
      }
    }